

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

BitWidth flexbuffers::Builder::WidthB(size_t byte_width)

{
  size_t byte_width_local;
  
  switch(byte_width) {
  case 1:
    byte_width_local._4_4_ = BIT_WIDTH_8;
    break;
  case 2:
    byte_width_local._4_4_ = BIT_WIDTH_16;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x5c5,"static BitWidth flexbuffers::Builder::WidthB(size_t)");
  case 4:
    byte_width_local._4_4_ = BIT_WIDTH_32;
    break;
  case 8:
    byte_width_local._4_4_ = BIT_WIDTH_64;
  }
  return byte_width_local._4_4_;
}

Assistant:

static BitWidth WidthB(size_t byte_width) {
    switch (byte_width) {
      case 1: return BIT_WIDTH_8;
      case 2: return BIT_WIDTH_16;
      case 4: return BIT_WIDTH_32;
      case 8: return BIT_WIDTH_64;
      default: FLATBUFFERS_ASSERT(false); return BIT_WIDTH_64;
    }
  }